

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar2_LibBuildBest_rec(Gia_Man_t *p,Dar_LibObj_t *pObj)

{
  int iVar1;
  int iVar2;
  Dar_LibDat_t *pDVar3;
  Dar_LibObj_t *pDVar4;
  Gia_Obj_t *pObj_00;
  int iFanin1;
  int iFanin0;
  Dar_LibDat_t *pData;
  Gia_Obj_t *pNode;
  Dar_LibObj_t *pObj_local;
  Gia_Man_t *p_local;
  
  pDVar3 = s_DarLib->pDatas + (int)(SUB84(*pObj,4) >> 4);
  if ((pDVar3->field_0).iGunc < 0) {
    pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pObj,0) & 0xffff);
    iVar1 = Dar2_LibBuildBest_rec(p,pDVar4);
    pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pObj,2) & 0xffff);
    iVar2 = Dar2_LibBuildBest_rec(p,pDVar4);
    iVar1 = Abc_LitNotCond(iVar1,SUB84(*pObj,4) & 1);
    iVar2 = Abc_LitNotCond(iVar2,SUB84(*pObj,4) >> 1 & 1);
    iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
    (pDVar3->field_0).iGunc = iVar1;
    iVar1 = Abc_Lit2Var((pDVar3->field_0).iGunc);
    pObj_00 = Gia_ManObj(p,iVar1);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      Gia_ObjSetAndLevel(p,pObj_00);
    }
    Gia_ObjSetPhase(p,pObj_00);
    p_local._4_4_ = (pDVar3->field_0).iGunc;
  }
  else {
    p_local._4_4_ = (pDVar3->field_0).iGunc;
  }
  return p_local._4_4_;
}

Assistant:

int Dar2_LibBuildBest_rec( Gia_Man_t * p, Dar_LibObj_t * pObj )
{
    Gia_Obj_t * pNode;
    Dar_LibDat_t * pData;
    int iFanin0, iFanin1;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->iGunc >= 0 )
        return pData->iGunc;
    iFanin0 = Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan0) );
    iFanin1 = Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan1) );
    iFanin0 = Abc_LitNotCond( iFanin0, pObj->fCompl0 );
    iFanin1 = Abc_LitNotCond( iFanin1, pObj->fCompl1 );
    pData->iGunc = Gia_ManHashAnd( p, iFanin0, iFanin1 );
    pNode = Gia_ManObj( p, Abc_Lit2Var(pData->iGunc) );
    if ( Gia_ObjIsAnd( pNode ) )
        Gia_ObjSetAndLevel( p, pNode );
    Gia_ObjSetPhase( p, pNode );
    return pData->iGunc;
}